

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  appender aVar1;
  undefined1 local_58 [8];
  digit_grouping<char> grouping;
  
  digit_grouping<char>::digit_grouping((digit_grouping<char> *)local_58,loc,true);
  aVar1 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                    ((appender)
                     (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container,
                     value,prefix,specs,(digit_grouping<char> *)local_58);
  (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container =
       (buffer<char> *)aVar1;
  if (local_58 != (undefined1  [8])&grouping.sep_.grouping._M_string_length) {
    operator_delete((void *)local_58,grouping.sep_.grouping._M_string_length + 1);
  }
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}